

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O1

iter __thiscall riffcpp::Chunk::begin(Chunk *this,bool no_chunk_id)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  __mbstate_t _Var4;
  impl *piVar5;
  byte in_DL;
  undefined7 in_register_00000031;
  
  piVar5 = (impl *)operator_new(0x30);
  (piVar5->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (piVar5->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar5->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (piVar5->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar5->m_pos)._M_off = 0;
  (piVar5->m_pos)._M_state.__count = 0;
  (piVar5->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  puVar1 = *(undefined8 **)CONCAT71(in_register_00000031,no_chunk_id);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[5];
  (piVar5->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(puVar1[4] + 8 + (ulong)(in_DL ^ 1) * 4);
  (piVar5->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  (piVar5->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)*puVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar5->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
  lVar3 = *(long *)CONCAT71(in_register_00000031,no_chunk_id);
  _Var4 = *(__mbstate_t *)(lVar3 + 0x38);
  (piVar5->m_pos)._M_off = *(streamoff *)(lVar3 + 0x30);
  (piVar5->m_pos)._M_state = _Var4;
  this->pimpl = piVar5;
  return (iter)(impl *)this;
}

Assistant:

iter riffcpp::Chunk::begin(bool no_chunk_id) {
  std::streamoff offs{no_chunk_id ? 8 : 12};
  auto it = new riffcpp::Chunk::iterator::impl();
  it->m_pos = pimpl->m_pos + offs;
  it->m_stream = pimpl->m_stream;
  it->m_limit = pimpl->m_limit;

  return iter{it};
}